

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Track::GetFirst(Track *this,BlockEntry **pBlockEntry)

{
  bool bVar1;
  uint uVar2;
  Segment *pSVar3;
  Segment *local_50;
  BlockEntry *pNextEntry;
  longlong tn;
  Block *pBlock;
  long status;
  Cluster *pCStack_28;
  int i;
  Cluster *pCluster;
  BlockEntry **pBlockEntry_local;
  Track *this_local;
  
  pCluster = (Cluster *)pBlockEntry;
  pBlockEntry_local = (BlockEntry **)this;
  pCStack_28 = Segment::GetFirst(this->m_pSegment);
  status._4_4_ = 0;
  do {
    while( true ) {
      if (pCStack_28 == (Cluster *)0x0) {
        pSVar3 = (Segment *)GetEOS(this);
        pCluster->m_pSegment = pSVar3;
        return 1;
      }
      bVar1 = Cluster::EOS(pCStack_28);
      if (bVar1) {
        bVar1 = Segment::DoneParsing(this->m_pSegment);
        if (!bVar1) {
          pCluster->m_pSegment = (Segment *)0x0;
          return -3;
        }
        pSVar3 = (Segment *)GetEOS(this);
        pCluster->m_pSegment = pSVar3;
        return 1;
      }
      pBlock = (Block *)Cluster::GetFirst(pCStack_28,(BlockEntry **)pCluster);
      if ((long)pBlock < 0) {
        return (long)pBlock;
      }
      if (pCluster->m_pSegment != (Segment *)0x0) break;
      pCStack_28 = Segment::GetNext(this->m_pSegment,pCStack_28);
    }
    while( true ) {
      tn = (*(code *)pCluster->m_pSegment->m_pReader[2]._vptr_IMkvReader)();
      if ((Block *)tn == (Block *)0x0) {
        __assert_fail("pBlock",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x124f,"long mkvparser::Track::GetFirst(const BlockEntry *&) const");
      }
      pNextEntry = (BlockEntry *)Block::GetTrackNumber((Block *)tn);
      if ((pNextEntry == (BlockEntry *)(this->m_info).number) &&
         (uVar2 = (*this->_vptr_Track[2])(this,pCluster->m_pSegment), (uVar2 & 1) != 0)) {
        return 0;
      }
      pBlock = (Block *)Cluster::GetNext(pCStack_28,(BlockEntry *)pCluster->m_pSegment,
                                         (BlockEntry **)&local_50);
      if ((long)pBlock < 0) {
        return (long)pBlock;
      }
      if (local_50 == (Segment *)0x0) break;
      pCluster->m_pSegment = local_50;
    }
    status._4_4_ = status._4_4_ + 1;
    if (99 < status._4_4_) {
      pSVar3 = (Segment *)GetEOS(this);
      pCluster->m_pSegment = pSVar3;
      return 1;
    }
    pCStack_28 = Segment::GetNext(this->m_pSegment,pCStack_28);
  } while( true );
}

Assistant:

long Track::GetFirst(const BlockEntry*& pBlockEntry) const {
  const Cluster* pCluster = m_pSegment->GetFirst();

  for (int i = 0;;) {
    if (pCluster == NULL) {
      pBlockEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pBlockEntry = GetEOS();
        return 1;
      }

      pBlockEntry = 0;
      return E_BUFFER_NOT_FULL;
    }

    long status = pCluster->GetFirst(pBlockEntry);

    if (status < 0)  // error
      return status;

    if (pBlockEntry == 0) {  // empty cluster
      pCluster = m_pSegment->GetNext(pCluster);
      continue;
    }

    for (;;) {
      const Block* const pBlock = pBlockEntry->GetBlock();
      assert(pBlock);

      const long long tn = pBlock->GetTrackNumber();

      if ((tn == m_info.number) && VetEntry(pBlockEntry))
        return 0;

      const BlockEntry* pNextEntry;

      status = pCluster->GetNext(pBlockEntry, pNextEntry);

      if (status < 0)  // error
        return status;

      if (pNextEntry == 0)
        break;

      pBlockEntry = pNextEntry;
    }

    ++i;

    if (i >= 100)
      break;

    pCluster = m_pSegment->GetNext(pCluster);
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number.  We interpret that as an error (which
  // might be too conservative).

  pBlockEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}